

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

sqlite3_value * sqlite3_value_dup(sqlite3_value *pOrig)

{
  ushort uVar1;
  char *pcVar2;
  u16 uVar3;
  u8 uVar4;
  u8 uVar5;
  int iVar6;
  Mem *pMem;
  
  if ((pOrig != (sqlite3_value *)0x0) && (pMem = (Mem *)sqlite3_malloc(0x38), pMem != (Mem *)0x0)) {
    pMem->szMalloc = 0;
    pMem->uTemp = 0;
    pMem->zMalloc = (char *)0x0;
    pMem->n = 0;
    pMem->flags = 0;
    pMem->enc = '\0';
    pMem->eSubtype = '\0';
    pMem->db = (sqlite3 *)0x0;
    (pMem->u).r = 0.0;
    pMem->z = (char *)0x0;
    pMem->xDel = (_func_void_void_ptr *)0x0;
    uVar3 = pOrig->flags;
    uVar4 = pOrig->enc;
    uVar5 = pOrig->eSubtype;
    pMem->n = pOrig->n;
    pMem->flags = uVar3;
    pMem->enc = uVar4;
    pMem->eSubtype = uVar5;
    pcVar2 = pOrig->z;
    pMem->u = pOrig->u;
    pMem->z = pcVar2;
    uVar1 = pMem->flags;
    pMem->flags = uVar1 & 0xefff;
    pMem->db = (sqlite3 *)0x0;
    if ((uVar1 & 0x12) == 0) {
      if ((uVar1 & 1) == 0) {
        return pMem;
      }
      pMem->flags = uVar1 & 0xe5ed;
      return pMem;
    }
    pMem->flags = uVar1 & 0x8fff | 0x4000;
    iVar6 = sqlite3VdbeMemMakeWriteable(pMem);
    if (iVar6 == 0) {
      return pMem;
    }
    sqlite3ValueFree(pMem);
  }
  return (sqlite3_value *)0x0;
}

Assistant:

SQLITE_API sqlite3_value *sqlite3_value_dup(const sqlite3_value *pOrig){
  sqlite3_value *pNew;
  if( pOrig==0 ) return 0;
  pNew = sqlite3_malloc( sizeof(*pNew) );
  if( pNew==0 ) return 0;
  memset(pNew, 0, sizeof(*pNew));
  memcpy(pNew, pOrig, MEMCELLSIZE);
  pNew->flags &= ~MEM_Dyn;
  pNew->db = 0;
  if( pNew->flags&(MEM_Str|MEM_Blob) ){
    pNew->flags &= ~(MEM_Static|MEM_Dyn);
    pNew->flags |= MEM_Ephem;
    if( sqlite3VdbeMemMakeWriteable(pNew)!=SQLITE_OK ){
      sqlite3ValueFree(pNew);
      pNew = 0;
    }
  }else if( pNew->flags & MEM_Null ){
    /* Do not duplicate pointer values */
    pNew->flags &= ~(MEM_Term|MEM_Subtype);
  }
  return pNew;
}